

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O0

void Eigen::internal::gemv_dense_selector<2,1,false>::
     run<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
               (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
                *lhs,Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *rhs,
               Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *dest,Scalar *alpha)

{
  float fVar1;
  ScalarWithConstIfNotLvalue *pSVar2;
  Scalar SVar3;
  ConstTransposeReturnType local_160;
  ConstRowXpr local_128;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_f0;
  long local_70;
  Index i;
  Index rows;
  type actual_rhs;
  Scalar *alpha_local;
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *dest_local;
  Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *rhs_local;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
  *lhs_local;
  
  actual_rhs.
  super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
  m_outerStride = (Index)alpha;
  memcpy(&rows,rhs,0x38);
  i = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>::rows
                ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0> *)
                 dest);
  for (local_70 = 0; local_70 < i; local_70 = local_70 + 1) {
    fVar1 = *(float *)actual_rhs.
                      super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                      .m_outerStride;
    DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>_>
    ::row(&local_128,
          (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>_>
           *)lhs,local_70);
    DenseBase<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::transpose
              (&local_160,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                *)&rows);
    MatrixBase<Eigen::Block<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>const,1,-1,true>>
    ::
    cwiseProduct<Eigen::Transpose<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const>>
              (&local_f0,
               (MatrixBase<Eigen::Block<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>>
                *)&local_128,
               (MatrixBase<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                *)&local_160);
    SVar3 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_1,_-1,_true>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>_>
            ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                   *)&local_f0);
    pSVar2 = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1>::
             coeffRef((MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                       *)dest,local_70);
    *pSVar2 = fVar1 * SVar3 + *pSVar2;
  }
  return;
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    EIGEN_STATIC_ASSERT((!nested_eval<Lhs,1>::Evaluate),EIGEN_INTERNAL_COMPILATION_ERROR_OR_YOU_MADE_A_PROGRAMMING_MISTAKE);
    typename nested_eval<Rhs,Lhs::RowsAtCompileTime>::type actual_rhs(rhs);
    const Index rows = dest.rows();
    for(Index i=0; i<rows; ++i)
      dest.coeffRef(i) += alpha * (lhs.row(i).cwiseProduct(actual_rhs.transpose())).sum();
  }